

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

void store_reset(void)

{
  store_conflict *store;
  store_conflict *psVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  
  for (uVar3 = 0; psVar1 = stores, uVar3 < z_info->store_max; uVar3 = uVar3 + 1) {
    store = stores + uVar3;
    stores[uVar3].stock_num = '\0';
    store_shuffle(store);
    object_pile_free((chunk *)0x0,(chunk *)0x0,psVar1[uVar3].stock_k);
    object_pile_free((chunk *)0x0,(chunk *)0x0,psVar1[uVar3].stock);
    psVar1[uVar3].stock = (object *)0x0;
    (&psVar1[uVar3].stock)[1] = (object *)0x0;
    if (psVar1[uVar3].feat != 0xe) {
      iVar2 = 10;
      while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
        store_maint(store);
      }
    }
  }
  return;
}

Assistant:

void store_reset(void) {
	int i, j;
	struct store *s;

	for (i = 0; i < z_info->store_max; i++) {
		s = &stores[i];
		s->stock_num = 0;
		store_shuffle(s);
		object_pile_free(NULL, NULL, s->stock_k);
		object_pile_free(NULL, NULL, s->stock);
		s->stock_k = NULL;
		s->stock = NULL;
		if (s->feat == FEAT_HOME)
			continue;
		for (j = 0; j < 10; j++)
			store_maint(s);
	}
}